

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# htmlparser_cpp_test.cc
# Opt level: O3

void __thiscall
ctemplate_htmlparser::HtmlparserCppTest::ValidateFile(HtmlparserCppTest *this,string *filename)

{
  int linecount;
  int iVar1;
  char *pcVar2;
  size_t sVar3;
  FILE *__stream;
  ulong uVar4;
  long lVar5;
  undefined8 extraout_RAX;
  long lVar6;
  ulong uVar7;
  char *__s;
  string annotation_block;
  string buffer;
  string dir;
  string fullpath;
  char buffer_1 [8092];
  string local_2060;
  HtmlparserCppTest *local_2040;
  undefined1 *local_2038;
  undefined8 local_2030;
  undefined1 local_2028 [16];
  undefined1 *local_2018 [2];
  undefined1 local_2008 [16];
  HtmlparserCppTest *local_1ff8 [2];
  undefined1 local_1fe8 [16];
  _Rb_tree_node_base *local_1fd8;
  int local_1fd0;
  _Rb_tree_node_base local_1fc8 [252];
  
  pcVar2 = getenv("TEMPLATE_ROOTDIR");
  __s = ".";
  if (pcVar2 != (char *)0x0) {
    __s = pcVar2;
  }
  local_1fd8 = local_1fc8;
  sVar3 = strlen(__s);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1fd8,__s,__s + sVar3);
  local_2060._M_dataplus._M_p = (pointer)&local_2060.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2060,"src","");
  ctemplate::PathJoin((string *)local_2018,(string *)&local_1fd8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2060._M_dataplus._M_p != &local_2060.field_2) {
    operator_delete(local_2060._M_dataplus._M_p);
  }
  if (local_1fd8 != local_1fc8) {
    operator_delete(local_1fd8);
  }
  local_2060._M_dataplus._M_p = (pointer)&local_2060.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2060,"tests","");
  ctemplate::PathJoin((string *)&local_1fd8,(string *)local_2018);
  std::__cxx11::string::operator=((string *)local_2018,(string *)&local_1fd8);
  if (local_1fd8 != local_1fc8) {
    operator_delete(local_1fd8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2060._M_dataplus._M_p != &local_2060.field_2) {
    operator_delete(local_2060._M_dataplus._M_p);
  }
  local_2060._M_dataplus._M_p = (pointer)&local_2060.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2060,"htmlparser_testdata","");
  ctemplate::PathJoin((string *)&local_1fd8,(string *)local_2018);
  std::__cxx11::string::operator=((string *)local_2018,(string *)&local_1fd8);
  if (local_1fd8 != local_1fc8) {
    operator_delete(local_1fd8);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2060._M_dataplus._M_p != &local_2060.field_2) {
    operator_delete(local_2060._M_dataplus._M_p);
  }
  ctemplate::PathJoin((string *)local_1ff8,(string *)local_2018);
  fprintf(_stderr,"Validating %s",local_1ff8[0]);
  local_2038 = local_2028;
  local_2030 = 0;
  local_2028[0] = 0;
  local_2040 = local_1ff8[0];
  __stream = fopen((char *)local_1ff8[0],"rb");
  if (__stream != (FILE *)0x0) {
    sVar3 = fread(&local_1fd8,1,0x1f9c,__stream);
    if (sVar3 != 0) {
      do {
        iVar1 = ferror(__stream);
        if (iVar1 != 0) {
          ValidateFile(local_2040);
          goto LAB_00107d3d;
        }
        local_2060._M_dataplus._M_p = (pointer)&local_2060.field_2;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_2060,&local_1fd8,(long)&local_1fd8 + sVar3);
        std::__cxx11::string::_M_append((char *)&local_2038,(ulong)local_2060._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2060._M_dataplus._M_p != &local_2060.field_2) {
          operator_delete(local_2060._M_dataplus._M_p);
        }
        sVar3 = fread(&local_1fd8,1,0x1f9c,__stream);
      } while (sVar3 != 0);
    }
    fclose(__stream);
    uVar4 = std::__cxx11::string::find((char *)&local_2038,0x10a020,0);
    lVar5 = std::__cxx11::string::find((char *)&local_2038,0x10a028,uVar4);
    if (uVar4 != 0xffffffffffffffff) {
      uVar7 = 0;
      do {
        std::__cxx11::string::string
                  ((string *)&local_1fd8,(string *)&local_2038,uVar7,uVar4 - uVar7);
        ctemplate_htmlparser::htmlparser_parse
                  ((this->parser_).parser_,(char *)local_1fd8,local_1fd0);
        std::__cxx11::string::string
                  ((string *)&local_2060,(string *)&local_2038,uVar4 + 7,lVar5 - (uVar4 + 7));
        ProcessAnnotation(this,&local_2060);
        iVar1 = ctemplate_htmlparser::htmlparser_get_line_number((this->parser_).parser_);
        if (CONCAT44(local_2060._M_string_length._4_4_,(int)local_2060._M_string_length) != 0) {
          lVar6 = 0;
          do {
            iVar1 = iVar1 + (uint)(local_2060._M_dataplus._M_p[lVar6] == '\n');
            lVar6 = lVar6 + 1;
          } while (CONCAT44(local_2060._M_string_length._4_4_,(int)local_2060._M_string_length) !=
                   lVar6);
        }
        ctemplate_htmlparser::htmlparser_set_line_number((this->parser_).parser_,iVar1);
        iVar1 = ctemplate_htmlparser::htmlparser_get_column_number((this->parser_).parser_);
        lVar6 = std::__cxx11::string::rfind((char)&local_2060,10);
        iVar1 = iVar1 + (int)local_2060._M_string_length + 9;
        if (lVar6 != -1) {
          iVar1 = ((int)local_2060._M_string_length - (int)lVar6) + 2;
        }
        ctemplate_htmlparser::htmlparser_set_column_number((this->parser_).parser_,iVar1);
        uVar7 = lVar5 + 2;
        uVar4 = std::__cxx11::string::find((char *)&local_2038,0x10a020,uVar7);
        lVar5 = std::__cxx11::string::find((char *)&local_2038,0x10a028,uVar4);
        if (lVar5 == -1 && uVar4 != 0xffffffffffffffff) goto LAB_00107d3d;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2060._M_dataplus._M_p != &local_2060.field_2) {
          operator_delete(local_2060._M_dataplus._M_p);
        }
        if (local_1fd8 != local_1fc8) {
          operator_delete(local_1fd8);
        }
      } while (uVar4 != 0xffffffffffffffff);
    }
    if (local_2038 != local_2028) {
      operator_delete(local_2038);
    }
    if (local_1ff8[0] != (HtmlparserCppTest *)local_1fe8) {
      operator_delete(local_1ff8[0]);
    }
    if (local_2018[0] != local_2008) {
      operator_delete(local_2018[0]);
    }
    return;
  }
LAB_00107d42:
  ValidateFile(local_2040);
  if (local_2018[0] != local_2008) {
    operator_delete(local_2018[0]);
  }
  _Unwind_Resume(extraout_RAX);
LAB_00107d3d:
  ValidateFile();
  goto LAB_00107d42;
}

Assistant:

void HtmlparserCppTest::ValidateFile(string filename) {
  // If TEMPLATE_ROOTDIR is set in the environment, it overrides the
  // default of ".".  We use an env-var rather than argv because
  // that's what automake supports most easily.
  const char* template_rootdir = getenv("TEMPLATE_ROOTDIR");
  if (template_rootdir == NULL)
    template_rootdir = DEFAULT_TEMPLATE_ROOTDIR;   // probably "."
  string dir = PathJoin(template_rootdir, "src");
  dir = PathJoin(dir, "tests");
  dir = PathJoin(dir, "htmlparser_testdata");
  const string fullpath = PathJoin(dir, filename);
  fprintf(stderr, "Validating %s", fullpath.c_str());
  string buffer;
  ReadToString(fullpath.c_str(), &buffer);

  // Start of the current html block.
  size_t start_html = 0;

  // Start of the next annotation.
  size_t start_annotation = buffer.find(kDirectiveBegin, 0);

  // Ending of the current annotation.
  size_t end_annotation = buffer.find(kDirectiveEnd, start_annotation);

  while (start_annotation != string::npos) {
    string html_block(buffer, start_html, start_annotation - start_html);
    parser_.Parse(html_block);

    start_annotation += strlen(kDirectiveBegin);

    string annotation_block(buffer, start_annotation,
                            end_annotation - start_annotation);
    ProcessAnnotation(annotation_block);

    // Update line and column count.
    parser_.set_line_number(UpdateLines(annotation_block,
                                        parser_.line_number()));
    parser_.set_column_number(UpdateColumns(annotation_block,
                                            parser_.column_number()));

    start_html = end_annotation + strlen(kDirectiveEnd);
    start_annotation = buffer.find(kDirectiveBegin, start_html);
    end_annotation = buffer.find(kDirectiveEnd, start_annotation);

    // Check for unclosed annotation.
    CHECK(!(start_annotation != string::npos &&
            end_annotation == string::npos));
  }
}